

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O0

UBool arrayEqual(void *a1,void *a2,int32_t size)

{
  int iVar1;
  int32_t size_local;
  void *a2_local;
  void *a1_local;
  
  if ((a1 == (void *)0x0) && (a2 == (void *)0x0)) {
    a1_local._7_1_ = true;
  }
  else if (((a1 == (void *)0x0) || (a2 != (void *)0x0)) &&
          ((a1 != (void *)0x0 || (a2 == (void *)0x0)))) {
    if (a1 == a2) {
      a1_local._7_1_ = true;
    }
    else {
      iVar1 = memcmp(a1,a2,(long)size);
      a1_local._7_1_ = iVar1 == 0;
    }
  }
  else {
    a1_local._7_1_ = false;
  }
  return a1_local._7_1_;
}

Assistant:

static UBool arrayEqual(const void *a1, const void *a2, int32_t size) {
    if (a1 == NULL && a2 == NULL) {
        return TRUE;
    }
    if ((a1 != NULL && a2 == NULL) || (a1 == NULL && a2 != NULL)) {
        return FALSE;
    }
    if (a1 == a2) {
        return TRUE;
    }

    return (uprv_memcmp(a1, a2, size) == 0);
}